

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void prvTidyParseNoFrames(TidyDocImpl *doc,Node *noframes,GetTokenMode mode)

{
  Lexer *pLVar1;
  Dict *pDVar2;
  Node *pNVar3;
  Bool BVar4;
  Node *node;
  Node *pNVar5;
  Node **ppNVar6;
  
  if ((doc->config).value[1].v == 0) {
    *(byte *)&doc->badAccess = (byte)doc->badAccess | 0x20;
  }
  pLVar1 = doc->lexer;
  node = prvTidyGetToken(doc,IgnoreWhitespace);
  if (node != (Node *)0x0) {
    do {
      pDVar2 = node->tag;
      if ((pDVar2 == noframes->tag) && (node->type == EndTag)) {
        prvTidyFreeNode(doc,node);
        noframes->closed = yes;
        TrimSpaces(doc,noframes);
        return;
      }
      if (pDVar2 == (Dict *)0x0) {
LAB_001446a9:
        BVar4 = InsertMisc(noframes,node);
        if (BVar4 == no) {
          if (((node->tag == (Dict *)0x0) || (node->tag->id != TidyTag_BODY)) ||
             (node->type != StartTag)) {
            BVar4 = prvTidynodeIsText(node);
            if ((BVar4 == no) && ((node->tag == (Dict *)0x0 || (node->type == EndTag)))) {
LAB_00144837:
              prvTidyReport(doc,noframes,node,0x235);
              goto LAB_0014484c;
            }
            pNVar5 = prvTidyFindBody(doc);
            if (pNVar5 == (Node *)0x0) {
              if (pLVar1->seenEndBody != no) goto LAB_00144837;
              prvTidyUngetToken(doc);
              node = prvTidyInferredTag(doc,TidyTag_BODY);
              if (*(int *)((doc->config).value + 100) != 0) {
                prvTidyReport(doc,noframes,node,0x247);
              }
              node->parent = noframes;
              pNVar5 = noframes->last;
              node->prev = pNVar5;
              ppNVar6 = &pNVar5->next;
              if (pNVar5 == (Node *)0x0) {
                ppNVar6 = &noframes->content;
              }
              *ppNVar6 = node;
              noframes->last = node;
            }
            else {
              BVar4 = prvTidynodeIsText(node);
              if (BVar4 != no) {
                prvTidyUngetToken(doc);
                node = prvTidyInferredTag(doc,TidyTag_P);
                prvTidyReport(doc,noframes,node,0x233);
              }
              node->parent = pNVar5;
              pNVar3 = pNVar5->last;
              node->prev = pNVar3;
              ppNVar6 = &pNVar5->content;
              if (pNVar3 != (Node *)0x0) {
                ppNVar6 = &pNVar3->next;
              }
              *ppNVar6 = node;
              pNVar5->last = node;
            }
            ParseTag(doc,node,IgnoreWhitespace);
          }
          else {
            BVar4 = pLVar1->seenEndBody;
            node->parent = noframes;
            pNVar5 = noframes->last;
            node->prev = pNVar5;
            ppNVar6 = &pNVar5->next;
            if (pNVar5 == (Node *)0x0) {
              ppNVar6 = &noframes->content;
            }
            *ppNVar6 = node;
            noframes->last = node;
            ParseTag(doc,node,IgnoreWhitespace);
            if ((BVar4 != no) && (pNVar5 = prvTidyFindBody(doc), pNVar5 != node)) {
              prvTidyCoerceNode(doc,node,TidyTag_DIV,no,no);
              pNVar5 = prvTidyFindBody(doc);
              if (pNVar5 != (Node *)0x0) {
                prvTidyRemoveNode(node);
                node->parent = pNVar5;
                pNVar3 = pNVar5->last;
                node->prev = pNVar3;
                ppNVar6 = &pNVar3->next;
                if (pNVar3 == (Node *)0x0) {
                  ppNVar6 = &pNVar5->content;
                }
                *ppNVar6 = node;
                pNVar5->last = node;
              }
            }
          }
        }
      }
      else {
        if (pDVar2->id == TidyTag_FRAME) {
LAB_001448e9:
          TrimSpaces(doc,noframes);
          if (node->type == EndTag) {
            prvTidyReport(doc,noframes,node,0x235);
            prvTidyFreeNode(doc,node);
            return;
          }
          prvTidyReport(doc,noframes,node,0x259);
          prvTidyUngetToken(doc);
          return;
        }
        if (pDVar2 == (Dict *)0x0) goto LAB_001446a9;
        if (pDVar2->id == TidyTag_FRAMESET) goto LAB_001448e9;
        if ((pDVar2 == (Dict *)0x0) || (pDVar2->id != TidyTag_HTML)) goto LAB_001446a9;
        BVar4 = prvTidynodeIsElement(node);
        if (BVar4 != no) goto LAB_00144837;
LAB_0014484c:
        prvTidyFreeNode(doc,node);
      }
      node = prvTidyGetToken(doc,IgnoreWhitespace);
    } while (node != (Node *)0x0);
  }
  prvTidyReport(doc,noframes,(Node *)0x0,0x25a);
  return;
}

Assistant:

void TY_(ParseNoFrames)(TidyDocImpl* doc, Node *noframes, GetTokenMode mode)
{
    Lexer* lexer = doc->lexer;
    Node *node;

    if ( cfg(doc, TidyAccessibilityCheckLevel) == 0 )
    {
        doc->badAccess |=  BA_USING_NOFRAMES;
    }
    mode = IgnoreWhitespace;

    while ( (node = TY_(GetToken)(doc, mode)) != NULL )
    {
        if ( node->tag == noframes->tag && node->type == EndTag )
        {
            TY_(FreeNode)( doc, node);
            noframes->closed = yes;
            TrimSpaces(doc, noframes);
            return;
        }

        if ( nodeIsFRAME(node) || nodeIsFRAMESET(node) )
        {
            TrimSpaces(doc, noframes);
            if (node->type == EndTag)
            {
                TY_(Report)(doc, noframes, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);       /* Throw it away */
            }
            else
            {
                TY_(Report)(doc, noframes, node, MISSING_ENDTAG_BEFORE);
                TY_(UngetToken)( doc );
            }
            return;
        }

        if ( nodeIsHTML(node) )
        {
            if (TY_(nodeIsElement)(node))
                TY_(Report)(doc, noframes, node, DISCARDING_UNEXPECTED);

            TY_(FreeNode)( doc, node);
            continue;
        }

        /* deal with comments etc. */
        if (InsertMisc(noframes, node))
            continue;

        if ( nodeIsBODY(node) && node->type == StartTag )
        {
            Bool seen_body = lexer->seenEndBody;
            TY_(InsertNodeAtEnd)(noframes, node);
            ParseTag(doc, node, IgnoreWhitespace /*MixedContent*/);

            /* fix for bug http://tidy.sf.net/bug/887259 */
            if (seen_body && TY_(FindBody)(doc) != node)
            {
                TY_(CoerceNode)(doc, node, TidyTag_DIV, no, no);
                MoveNodeToBody(doc, node);
            }
            continue;
        }

        /* implicit body element inferred */
        if (TY_(nodeIsText)(node) || (node->tag && node->type != EndTag))
        {
            Node *body = TY_(FindBody)( doc );
            if ( body || lexer->seenEndBody )
            {
                if ( body == NULL )
                {
                    TY_(Report)(doc, noframes, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }
                if ( TY_(nodeIsText)(node) )
                {
                    TY_(UngetToken)( doc );
                    node = TY_(InferredTag)(doc, TidyTag_P);
                    TY_(Report)(doc, noframes, node, CONTENT_AFTER_BODY );
                }
                TY_(InsertNodeAtEnd)( body, node );
            }
            else
            {
                TY_(UngetToken)( doc );
                node = TY_(InferredTag)(doc, TidyTag_BODY);
                if ( cfgBool(doc, TidyXmlOut) )
                    TY_(Report)(doc, noframes, node, INSERTING_TAG);
                TY_(InsertNodeAtEnd)( noframes, node );
            }

            ParseTag( doc, node, IgnoreWhitespace /*MixedContent*/ );
            continue;
        }

        /* discard unexpected end tags */
        TY_(Report)(doc, noframes, node, DISCARDING_UNEXPECTED);
        TY_(FreeNode)( doc, node);
    }

    TY_(Report)(doc, noframes, node, MISSING_ENDTAG_FOR);
}